

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

int Tim_ManBlackBoxNum(Tim_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Tim_Box_t *pBox;
  Tim_Man_t *p_local;
  
  local_20 = 0;
  iVar1 = Tim_ManBoxNum(p);
  if (iVar1 != 0) {
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vBoxes), local_1c < iVar1; local_1c = local_1c + 1) {
      pvVar2 = Vec_PtrEntry(p->vBoxes,local_1c);
      local_20 = *(int *)((long)pvVar2 + 0x18) + local_20;
    }
  }
  return local_20;
}

Assistant:

int Tim_ManBlackBoxNum( Tim_Man_t * p )
{
    Tim_Box_t * pBox;
    int i, Counter = 0;
    if ( Tim_ManBoxNum(p) )
        Tim_ManForEachBox( p, pBox, i )
            Counter += pBox->fBlack;
    return Counter;
}